

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn_dh.c
# Opt level: O0

int isobusfs_cmn_dh_validate_dir_path(char *path,_Bool writable)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  byte in_SIL;
  char *in_RDI;
  int ret;
  int mode;
  stat path_stat;
  stat local_a8;
  byte local_11;
  char *local_10;
  int local_4;
  
  local_11 = in_SIL & 1;
  uVar1 = 0;
  if (local_11 != 0) {
    uVar1 = 2;
  }
  local_10 = in_RDI;
  iVar2 = access(in_RDI,uVar1 | 4);
  if (iVar2 == -1) {
    piVar3 = __errno_location();
    iVar2 = *piVar3;
    pcVar4 = "";
    if ((local_11 & 1) != 0) {
      pcVar4 = "and write";
    }
    pcVar5 = strerror(-iVar2);
    isobusfs_log(LOG_LEVEL_ERROR,"failed to acces path %s, for read %s. %s",local_10,pcVar4,pcVar5);
    local_4 = -iVar2;
  }
  else {
    iVar2 = stat(local_10,&local_a8);
    if (iVar2 == -1) {
      piVar3 = __errno_location();
      iVar2 = *piVar3;
      pcVar4 = strerror(-iVar2);
      isobusfs_log(LOG_LEVEL_ERROR,"failed to get stat information on path %s. %s",local_10,pcVar4);
      local_4 = -iVar2;
    }
    else if ((local_a8.st_mode & 0xf000) == 0x4000) {
      local_4 = 0;
    }
    else {
      isobusfs_log(LOG_LEVEL_ERROR,"path %s is not a directory",local_10);
      local_4 = -0x14;
    }
  }
  return local_4;
}

Assistant:

int isobusfs_cmn_dh_validate_dir_path(const char *path, bool writable)
{
	struct stat path_stat;
	int mode = R_OK;
	int ret;

	mode |= writable ? W_OK : 0;
	ret = access(path, mode);
	if (ret == -1) {
		ret = -errno;
		pr_err("failed to acces path %s, for read %s. %s", path,
		       writable ? "and write" : "", strerror(ret));
		return ret;
	}

	ret = stat(path, &path_stat);
	if (ret == -1) {
		ret = -errno;
		pr_err("failed to get stat information on path %s. %s", path,
			strerror(ret));
		return ret;
	}

	if (!S_ISDIR(path_stat.st_mode)) {
		pr_err("path %s is not a directory", path);
		return -ENOTDIR;
	}

	return 0;
}